

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

TRef lj_record_idx(jit_State *J,RecordIndex *ix)

{
  int *piVar1;
  cTValue *ptr;
  double dVar2;
  char cVar3;
  byte bVar4;
  IRRef1 IVar5;
  IRRef1 IVar6;
  ushort uVar7;
  IRRef2 IVar8;
  IRRef2 IVar9;
  IRIns *pIVar10;
  TRef *pTVar11;
  TValue *pTVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  TRef TVar16;
  uint uVar17;
  TRef TVar18;
  BCReg func;
  cTValue *pcVar19;
  uint uVar20;
  ushort uVar21;
  ulong uVar22;
  ptrdiff_t nargs;
  ushort uVar23;
  bool bVar24;
  code *cont;
  ulong uVar25;
  ulong uVar26;
  ulong in_R9;
  ulong uVar27;
  GCtab *t;
  uint uVar28;
  TRef local_40;
  
  pTVar12 = &ix->keyv;
  ptr = (cTValue *)(J[-1].penalty + 0x38);
LAB_0012feea:
  uVar15 = ix->tab;
  if ((uVar15 & 0x1f000000) == 0xb000000) {
    uVar17 = (ix->keyv).field_2.it;
    if ((uVar17 == 0xffffffff) || ((uVar17 < 0xfffeffff && (NAN(pTVar12->n))))) {
      if (ix->val != 0) {
        lj_trace_err(J,LJ_TRERR_STORENN);
      }
      if ((ix->key & 0x8000) == 0) {
        if (ix->idxchain == 0) {
          return 0x7fff;
        }
        iVar14 = lj_record_mm_lookup(J,ix,MM_index);
        if (iVar14 == 0) {
          return 0x7fff;
        }
        goto LAB_00130929;
      }
    }
    t = (GCtab *)(ulong)(ix->tabv).u32.lo;
    pcVar19 = lj_tab_get(J->L,t,pTVar12);
    ix->oldv = pcVar19;
    uVar17 = ix->key;
    if ((uVar17 >> 0x18 & 0x1e) - 0xe < 6) {
      dVar2 = pTVar12->n;
      uVar28 = (int)dVar2;
      if ((double)(int)dVar2 != dVar2) {
        uVar28 = 0x8000001;
      }
      if (NAN((double)(int)dVar2) || NAN(dVar2)) {
        uVar28 = 0x8000001;
      }
      if (uVar28 < 0x8000001) {
        if ((uVar17 & 0x1f000000) == 0xe000000) {
          (J->fold).ins.field_0.op1 = (IRRef1)uVar17;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5593226e;
LAB_0012fff1:
          uVar15 = lj_opt_fold(J);
        }
        else {
          pIVar10 = (J->cur).ir;
          uVar20 = uVar17 & 0xffff;
          bVar4 = *(byte *)((long)pIVar10 + (ulong)uVar20 * 8 + 5);
          uVar15 = uVar17;
          if ((byte)(bVar4 - 0x35) < 2) {
            IVar5 = *(IRRef1 *)((long)pIVar10 + (ulong)uVar20 * 8 + 2);
            if ((-1 < (long)(short)IVar5) &&
               (-1 < (int)(pIVar10[(short)IVar5].field_1.op12 + 0x40000000))) {
              IVar6 = pIVar10[uVar20].field_0.op1;
              (J->fold).ins.field_0.ot = (ushort)bVar4 * 0x100 - 0xced;
              (J->fold).ins.field_0.op1 = IVar6;
              (J->fold).ins.field_0.op2 = IVar5;
              goto LAB_0012fff1;
            }
          }
        }
        (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43130006;
        TVar16 = lj_opt_fold(J);
        if (uVar28 < t->asize) {
          rec_idx_abc(J,TVar16,uVar15,t->asize);
          (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43050004;
          TVar16 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = 0x3805;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar16;
          (J->fold).ins.field_0.op2 = (IRRef1)uVar15;
          uVar15 = lj_opt_fold(J);
          bVar24 = false;
        }
        else {
          (J->fold).ins.field_0.ot = 0x693;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar16;
          (J->fold).ins.field_0.op2 = (IRRef1)uVar15;
          lj_opt_fold(J);
          if (uVar28 == 0 && (uVar17 & 0x8000) == 0) {
            pcVar19 = lj_ir_k64_find(J,0);
            uVar17 = lj_ir_k64(J,IR_KNUM,pcVar19);
          }
          bVar24 = true;
        }
      }
      else {
        bVar24 = true;
        if ((short)(IRRef1)uVar17 < 0) {
          if (t->asize != 0) {
            lj_trace_err(J,LJ_TRERR_NYITMIX);
          }
          (J->fold).ins.field_0.op1 = (IRRef1)uVar15;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43130006;
          uVar15 = lj_opt_fold(J);
          TVar16 = lj_ir_kint(J,0);
          (J->fold).ins.field_0.ot = 0x893;
          (J->fold).ins.field_0.op1 = (IRRef1)uVar15;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar16;
          lj_opt_fold(J);
        }
      }
      if (bVar24) goto LAB_00130194;
    }
    else {
LAB_00130194:
      if (t->hmask == 0) {
        (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43130007;
        TVar16 = lj_opt_fold(J);
        TVar18 = lj_ir_kint(J,0);
        (J->fold).ins.field_0.ot = 0x893;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar16;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar18;
        lj_opt_fold(J);
        uVar15 = lj_ir_kptr_(J,IR_KKPTR,ptr);
      }
      else {
        if ((uVar17 >> 0x18 & 0x1f) - 0xf < 5) {
          (J->fold).ins.field_0.op1 = (IRRef1)uVar17;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x550e01d3;
          uVar17 = lj_opt_fold(J);
        }
        if (-1 < (short)(IRRef1)uVar17) {
          bVar24 = true;
          if ((t->hmask != 0) &&
             (uVar28 = *(int *)&ix->oldv - (t->node).ptr32,
             uVar28 < 0x17ffe9 && uVar28 <= t->hmask * 0x18)) {
            (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43130007;
            TVar16 = lj_opt_fold(J);
            TVar18 = lj_ir_kint(J,t->hmask);
            (J->fold).ins.field_0.ot = 0x893;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar16;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar18;
            lj_opt_fold(J);
            (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43050005;
            TVar16 = lj_opt_fold(J);
            TVar18 = lj_ir_kslot(J,uVar17,uVar28 / 0x18);
            (J->fold).ins.field_0.ot = 0x3985;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar16;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar18;
            uVar15 = lj_opt_fold(J);
            bVar24 = false;
          }
          if (!bVar24) goto LAB_00130344;
        }
        TVar16 = ix->tab;
        (J->fold).ins.field_0.ot = 0x3a05;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar16;
        (J->fold).ins.field_0.op2 = (IRRef1)uVar17;
        uVar15 = lj_opt_fold(J);
      }
    }
LAB_00130344:
    uVar23 = (ushort)uVar15;
    pIVar10 = (J->cur).ir;
    uVar15 = uVar15 & 0xffff;
    uVar22 = (ulong)uVar15;
    cVar3 = *(char *)((long)pIVar10 + uVar22 * 8 + 5);
    if (cVar3 == '\x19') {
      pcVar19 = (cTValue *)(ulong)pIVar10[uVar22].field_1.op12;
    }
    else {
      pcVar19 = ix->oldv;
    }
    uVar17 = cVar3 == '8' ^ 0x41;
    if (ix->val == 0) {
      uVar15 = (pcVar19->field_2).it;
      uVar28 = ~uVar15;
      if ((uVar15 & 0xffff8000) == 0xffff0000) {
        uVar28 = 3;
      }
      if (uVar15 < 0xfffeffff) {
        uVar28 = 0xe;
      }
      if (pcVar19 == ptr) {
        TVar16 = lj_ir_kptr_(J,IR_KKPTR,ptr);
        (J->fold).ins.field_0.ot = 0x885;
        (J->fold).ins.field_0.op1 = uVar23;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar16;
        lj_opt_fold(J);
        TVar16 = 0x7fff;
      }
      else {
        (J->fold).ins.field_0.ot = (ushort)(uVar17 << 8) | (ushort)uVar28 | 0x80;
        (J->fold).ins.field_0.op1 = uVar23;
        (J->fold).ins.field_0.op2 = 0;
        TVar16 = lj_opt_fold(J);
      }
      if ((uVar28 == 0) && (ix->idxchain != 0)) {
        iVar14 = lj_record_mm_lookup(J,ix,MM_index);
        bVar24 = true;
        if (iVar14 == 0) goto LAB_00130642;
      }
      else {
LAB_00130642:
        local_40 = TVar16;
        if (uVar28 < 3) {
          local_40 = uVar28 * 0xffffff + 0x7fff;
        }
        bVar24 = false;
      }
      if (!bVar24) {
        return local_40;
      }
      goto LAB_00130929;
    }
    uVar28 = *(uint *)((ulong)(ix->tabv).u32.lo + 0x10);
    uVar25 = (ulong)uVar28;
    bVar24 = (ix->val & 0x1f000000) != 0 && (*(byte *)((long)&ix->key + 3) & 0x1f) - 4 < 9;
    if ((pcVar19->field_2).it != 0xffffffff) {
      uVar28 = (uint)J->chain[(ulong)uVar17 + 7];
      uVar27 = in_R9;
      do {
        if (uVar28 <= uVar15) {
          uVar26 = uVar27 & 0xffffffff;
          uVar22 = (ulong)J->chain[uVar17];
          goto LAB_0013054b;
        }
        uVar26 = (ulong)uVar28;
        bVar4 = *(byte *)((long)pIVar10 + uVar26 * 8 + 4);
        if (pIVar10[uVar26].field_0.op1 == uVar23) {
          in_R9 = (ulong)((bVar4 & 0x1f) != 0);
LAB_001303e8:
          bVar13 = false;
        }
        else {
          if ((bVar4 & 0x1f) == 0) {
            uVar21 = *(ushort *)((long)pIVar10 + (ulong)pIVar10[uVar26].field_0.op1 * 8 + 2);
            uVar7 = *(ushort *)((long)pIVar10 + uVar22 * 8 + 2);
            if ((cVar3 == '8') ||
               (((*(byte *)((long)pIVar10 + (ulong)uVar7 * 8 + 4) ^
                 *(byte *)((long)pIVar10 + (ulong)uVar21 * 8 + 4)) & 0x1f) == 0)) {
              bVar13 = false;
              if (uVar21 == uVar7) {
                in_R9 = 0;
              }
              else {
                in_R9 = 0;
                if (-1 < (short)(uVar21 | uVar7)) goto LAB_00130430;
              }
            }
            else {
LAB_00130430:
              bVar13 = true;
              in_R9 = uVar27 & 0xffffffff;
            }
            if (!bVar13) goto LAB_001303e8;
          }
          else {
            in_R9 = uVar27 & 0xffffffff;
          }
          uVar28 = (uint)*(ushort *)((long)pIVar10 + uVar26 * 8 + 6);
          bVar13 = true;
        }
        iVar14 = (int)in_R9;
        uVar27 = in_R9;
      } while (bVar13);
      goto LAB_0013068d;
    }
    if ((ix->idxchain == 0) || (uVar28 == 0)) {
LAB_0013057f:
      if (cVar3 == ':') {
        TVar16 = lj_ir_kptr_(J,IR_KKPTR,ptr);
        (J->fold).ins.field_0.ot = (ushort)(pcVar19 != ptr) << 8 | 0x885;
        (J->fold).ins.field_0.op1 = uVar23;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar16;
        goto LAB_001305c0;
      }
    }
    else {
      uVar15 = J[-1].bpropcache[10].mode;
      uVar22 = (ulong)*(uint *)(uVar25 + 0x14) +
               (ulong)(*(uint *)(uVar25 + 0x1c) & *(uint *)((ulong)uVar15 + 8)) * 0x18;
      do {
        if ((*(int *)(uVar22 + 0xc) == -5) && (*(uint *)(uVar22 + 8) == uVar15)) goto LAB_0013050e;
        uVar22 = (ulong)*(uint *)(uVar22 + 0x10);
      } while (uVar22 != 0);
      uVar22 = 0;
LAB_0013050e:
      if ((uVar22 == 0) || (*(int *)(uVar22 + 4) == -1)) goto LAB_0013057f;
      (J->fold).ins.field_0.ot = (ushort)(uVar17 << 8) | 0x80;
      (J->fold).ins.field_0.op1 = uVar23;
      (J->fold).ins.field_0.op2 = 0;
LAB_001305c0:
      lj_opt_fold(J);
    }
    if ((ix->idxchain == 0) || (iVar14 = lj_record_mm_lookup(J,ix,MM_newindex), iVar14 == 0)) {
      iVar14 = 0;
      bVar13 = true;
      if (pcVar19 == ptr) {
        uVar15 = ix->key;
        if ((uVar15 >> 0x18 & 0x1f) - 0xf < 5) {
          (J->fold).ins.field_0.op1 = (IRRef1)uVar15;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x550e01d3;
          uVar15 = lj_opt_fold(J);
        }
        TVar16 = ix->tab;
        (J->fold).ins.field_0.ot = 0x3b05;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar16;
        (J->fold).ins.field_0.op2 = (IRRef1)uVar15;
        TVar16 = lj_opt_fold(J);
        uVar23 = (ushort)TVar16;
        bVar24 = false;
        iVar14 = 0;
        bVar13 = true;
      }
    }
    else {
      iVar14 = 4;
      bVar13 = false;
    }
    if (bVar13) goto LAB_001307f4;
    goto LAB_00130915;
  }
  iVar14 = lj_record_mm_lookup(J,ix,(uint)(ix->val != 0));
  if (iVar14 == 0) {
    lj_trace_err(J,LJ_TRERR_NOMM);
  }
  goto LAB_00130929;
  while( true ) {
    if (pIVar10[in_R9].field_0.op1 == uVar23) {
      uVar26 = (ulong)((*(byte *)((long)pIVar10 + in_R9 * 8 + 4) & 0x1f) != 0);
      uVar22 = in_R9;
    }
    else {
      uVar22 = (ulong)*(ushort *)((long)pIVar10 + in_R9 * 8 + 6);
    }
    iVar14 = (int)uVar26;
    uVar27 = in_R9;
    if (pIVar10[in_R9].field_0.op1 == uVar23) break;
LAB_0013054b:
    in_R9 = uVar22;
    if ((uint)in_R9 <= uVar15) {
      iVar14 = 0;
      in_R9 = uVar27;
      break;
    }
  }
LAB_0013068d:
  if (iVar14 == 0) {
    if (cVar3 == ':') {
      TVar16 = lj_ir_kptr_(J,IR_KKPTR,ptr);
      (J->fold).ins.field_0.ot = 0x985;
      (J->fold).ins.field_0.op1 = uVar23;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar16;
      lj_opt_fold(J);
    }
    if (ix->idxchain != 0) {
      if (uVar25 == 0) {
        (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x430b0003;
        TVar16 = lj_opt_fold(J);
        TVar18 = lj_ir_knull(J,IRT_TAB);
        (J->fold).ins.field_0.ot = 0x88b;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar16;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar18;
      }
      else {
        uVar15 = (pcVar19->field_2).it;
        uVar21 = ~(ushort)uVar15 | 0x80;
        if ((uVar15 & 0xffff8000) == 0xffff0000) {
          uVar21 = 0x83;
        }
        if (uVar15 < 0xfffeffff) {
          uVar21 = 0x8e;
        }
        (J->fold).ins.field_0.ot = uVar21 | (ushort)(uVar17 << 8);
        (J->fold).ins.field_0.op1 = uVar23;
        (J->fold).ins.field_0.op2 = 0;
      }
      lj_opt_fold(J);
    }
  }
  else {
    bVar24 = false;
  }
LAB_001307f4:
  if ((ix->val >> 0x18 & 0x1f) - 0xf < 5) {
    (J->fold).ins.field_0.op1 = (IRRef1)ix->val;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x550e01d3;
    TVar16 = lj_opt_fold(J);
    ix->val = TVar16;
  }
  TVar16 = ix->val;
  (J->fold).ins.field_0.ot = ((ushort)(uVar17 << 8) | (byte)(TVar16 >> 0x18) & 0x7f1f) + 0x700;
  (J->fold).ins.field_0.op1 = uVar23;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar16;
  lj_opt_fold(J);
  if ((bVar24) || ((*(byte *)((long)&ix->val + 3) & 0x1f) - 4 < 9)) {
    (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x52000000;
    lj_opt_fold(J);
  }
  uVar15 = ix->key;
  if ((uVar15 & 0x1f000000) == 0x4000000) {
    if ((-1 < (short)uVar15) &&
       (IVar8 = (J->cur).ir[uVar15 & 0x7fff].field_1.op12, IVar9._0_2_ = J[-1].bpropcache[10].key,
       IVar9._2_2_ = J[-1].bpropcache[10].val, IVar9 != IVar8)) {
      uVar22 = 0;
      do {
        uVar25 = uVar22;
        if (uVar25 == 5) goto LAB_00130907;
        uVar22 = uVar25 + 1;
      } while (*(IRRef2 *)((long)J + uVar25 * 4 + -0x94) != IVar8);
      if (4 < uVar25) goto LAB_00130907;
    }
    (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e050008;
    TVar16 = lj_opt_fold(J);
    TVar18 = lj_ir_kint(J,0);
    (J->fold).ins.field_0.ot = 0x4a10;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar16;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar18;
    lj_opt_fold(J);
  }
LAB_00130907:
  J->needsnap = '\x01';
  local_40 = 0;
  iVar14 = 1;
LAB_00130915:
  if (iVar14 == 4) {
LAB_00130929:
    if ((ix->mobj & 0x1f000000) != 0x8000000) {
      ix->tab = ix->mobj;
      ix->tabv = ix->mobjv;
      piVar1 = &ix->idxchain;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        lj_trace_err(J,LJ_TRERR_IDXLOOP);
      }
      goto LAB_0012feea;
    }
    cont = lj_cont_nop;
    if (ix->val == 0) {
      cont = lj_cont_ra;
    }
    func = rec_mm_prep(J,cont);
    pTVar11 = J->base;
    uVar22 = (ulong)func;
    pTVar12 = J->L->base;
    pTVar11[uVar22] = ix->mobj;
    pTVar11[uVar22 + 1] = ix->tab;
    pTVar11[uVar22 + 2] = ix->key;
    pTVar12[uVar22].field_2.field_0 = (ix->mobjv).field_2.field_0;
    *(undefined4 *)((long)pTVar12 + uVar22 * 8 + 4) = 0xfffffff7;
    pTVar12[uVar22 + 1].field_2 = (anon_struct_8_2_fd66bcdd_for_TValue_2)ix->tabv;
    pTVar12[uVar22 + 2] = ix->keyv;
    if (ix->val == 0) {
      nargs = 2;
    }
    else {
      pTVar11[uVar22 + 3] = ix->val;
      pTVar12[uVar22 + 3] = ix->valv;
      nargs = 3;
    }
    rec_call_setup(J,func,nargs);
    J->framedepth = J->framedepth + 1;
    J->base = J->base + uVar22 + 1;
    J->baseslot = J->baseslot + func + 1;
    local_40 = 0;
  }
  return local_40;
}

Assistant:

TRef lj_record_idx(jit_State *J, RecordIndex *ix)
{
  TRef xref;
  IROp xrefop, loadop;
  cTValue *oldv;

  while (!tref_istab(ix->tab)) { /* Handle non-table lookup. */
    /* Never call raw lj_record_idx() on non-table. */
    lua_assert(ix->idxchain != 0);
    if (!lj_record_mm_lookup(J, ix, ix->val ? MM_newindex : MM_index))
      lj_trace_err(J, LJ_TRERR_NOMM);
  handlemm:
    if (tref_isfunc(ix->mobj)) {  /* Handle metamethod call. */
      BCReg func = rec_mm_prep(J, ix->val ? lj_cont_nop : lj_cont_ra);
      TRef *base = J->base + func;
      TValue *tv = J->L->base + func;
      base[0] = ix->mobj; base[1] = ix->tab; base[2] = ix->key;
      setfuncV(J->L, tv+0, funcV(&ix->mobjv));
      copyTV(J->L, tv+1, &ix->tabv);
      copyTV(J->L, tv+2, &ix->keyv);
      if (ix->val) {
	base[3] = ix->val;
	copyTV(J->L, tv+3, &ix->valv);
	lj_record_call(J, func, 3);  /* mobj(tab, key, val) */
	return 0;
      } else {
	lj_record_call(J, func, 2);  /* res = mobj(tab, key) */
	return 0;  /* No result yet. */
      }
    }
    /* Otherwise retry lookup with metaobject. */
    ix->tab = ix->mobj;
    copyTV(J->L, &ix->tabv, &ix->mobjv);
    if (--ix->idxchain == 0)
      lj_trace_err(J, LJ_TRERR_IDXLOOP);
  }

  /* First catch nil and NaN keys for tables. */
  if (tvisnil(&ix->keyv) || (tvisnum(&ix->keyv) && tvisnan(&ix->keyv))) {
    if (ix->val)  /* Better fail early. */
      lj_trace_err(J, LJ_TRERR_STORENN);
    if (tref_isk(ix->key)) {
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
	goto handlemm;
      return TREF_NIL;
    }
  }

  /* Record the key lookup. */
  xref = rec_idx_key(J, ix);
  xrefop = IR(tref_ref(xref))->o;
  loadop = xrefop == IR_AREF ? IR_ALOAD : IR_HLOAD;
  /* The lj_meta_tset() inconsistency is gone, but better play safe. */
  oldv = xrefop == IR_KKPTR ? (cTValue *)ir_kptr(IR(tref_ref(xref))) : ix->oldv;

  if (ix->val == 0) {  /* Indexed load */
    IRType t = itype2irt(oldv);
    TRef res;
    if (oldv == niltvg(J2G(J))) {
      emitir(IRTG(IR_EQ, IRT_P32), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      res = TREF_NIL;
    } else {
      res = emitir(IRTG(loadop, t), xref, 0);
    }
    if (t == IRT_NIL && ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
      goto handlemm;
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitives. */
    return res;
  } else {  /* Indexed store. */
    GCtab *mt = tabref(tabV(&ix->tabv)->metatable);
    int keybarrier = tref_isgcv(ix->key) && !tref_isnil(ix->val);
    if (tvisnil(oldv)) {  /* Previous value was nil? */
      /* Need to duplicate the hasmm check for the early guards. */
      int hasmm = 0;
      if (ix->idxchain && mt) {
	cTValue *mo = lj_tab_getstr(mt, mmname_str(J2G(J), MM_newindex));
	hasmm = mo && !tvisnil(mo);
      }
      if (hasmm)
	emitir(IRTG(loadop, IRT_NIL), xref, 0);  /* Guard for nil value. */
      else if (xrefop == IR_HREF)
	emitir(IRTG(oldv == niltvg(J2G(J)) ? IR_EQ : IR_NE, IRT_P32),
	       xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_newindex)) {
	lua_assert(hasmm);
	goto handlemm;
      }
      lua_assert(!hasmm);
      if (oldv == niltvg(J2G(J))) {  /* Need to insert a new key. */
	TRef key = ix->key;
	if (tref_isinteger(key))  /* NEWREF needs a TValue as a key. */
	  key = emitir(IRTN(IR_CONV), key, IRCONV_NUM_INT);
	xref = emitir(IRT(IR_NEWREF, IRT_P32), ix->tab, key);
	keybarrier = 0;  /* NEWREF already takes care of the key barrier. */
      }
    } else if (!lj_opt_fwd_wasnonnil(J, loadop, tref_ref(xref))) {
      /* Cannot derive that the previous value was non-nil, must do checks. */
      if (xrefop == IR_HREF)  /* Guard against store to niltv. */
	emitir(IRTG(IR_NE, IRT_P32), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain) {  /* Metamethod lookup required? */
	/* A check for NULL metatable is cheaper (hoistable) than a load. */
	if (!mt) {
	  TRef mtref = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_TAB_META);
	  emitir(IRTG(IR_EQ, IRT_TAB), mtref, lj_ir_knull(J, IRT_TAB));
	} else {
	  IRType t = itype2irt(oldv);
	  emitir(IRTG(loadop, t), xref, 0);  /* Guard for non-nil value. */
	}
      }
    } else {
      keybarrier = 0;  /* Previous non-nil value kept the key alive. */
    }
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(ix->val))
      ix->val = emitir(IRTN(IR_CONV), ix->val, IRCONV_NUM_INT);
    emitir(IRT(loadop+IRDELTA_L2S, tref_type(ix->val)), xref, ix->val);
    if (keybarrier || tref_isgcv(ix->val))
      emitir(IRT(IR_TBAR, IRT_NIL), ix->tab, 0);
    /* Invalidate neg. metamethod cache for stores with certain string keys. */
    if (!nommstr(J, ix->key)) {
      TRef fref = emitir(IRT(IR_FREF, IRT_P32), ix->tab, IRFL_TAB_NOMM);
      emitir(IRT(IR_FSTORE, IRT_U8), fref, lj_ir_kint(J, 0));
    }
    J->needsnap = 1;
    return 0;
  }
}